

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

void __thiscall wabt::interp::Exception::Mark(Exception *this,Store *store)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  Ptr tag;
  ValueTypes params;
  RefPtr<wabt::interp::Tag> local_58;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_40;
  
  RefPtr<wabt::interp::Tag>::RefPtr(&local_58,store,(Ref)(this->tag_).index);
  Store::Mark(store,(Ref)(this->tag_).index);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            (&local_40,&((local_58.obj_)->type_).signature);
  if (local_40.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_40.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      uVar1 = local_40.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start[uVar2].enum_ + 0x17;
      if ((uVar1 < 8) && ((0xc5U >> (uVar1 & 0x1f) & 1) != 0)) {
        Store::Mark(store,(Ref)*(size_t *)
                                ((long)&((this->args_).
                                         super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar3
                                ));
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (ulong)((long)local_40.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_40.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_40.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.obj_ != (Tag *)0x0) {
    Store::DeleteRoot(local_58.store_,local_58.root_index_);
  }
  return;
}

Assistant:

void Exception::Mark(Store& store) {
  Tag::Ptr tag(store, tag_);
  store.Mark(tag_);
  ValueTypes params = tag->type().signature;
  for (size_t i = 0; i < params.size(); i++) {
    if (params[i].IsRef()) {
      store.Mark(args_[i].Get<Ref>());
    }
  }
}